

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O2

void __thiscall
deqp::gls::LongStressCaseInternal::DebugInfoRenderer::DebugInfoRenderer
          (DebugInfoRenderer *this,RenderContext *ctx)

{
  ShaderProgram *this_00;
  allocator<char> local_12a;
  allocator<char> local_129;
  string local_128;
  string local_108;
  ProgramSources local_e8;
  
  this->m_ctx = ctx;
  this->m_prog = (ShaderProgram *)0x0;
  (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->m_ndxBuf).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ndxBuf).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_ndxBuf).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (ShaderProgram *)operator_new(0xd0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,
             "attribute highp vec2 a_pos;\nvoid main (void)\n{\n\tgl_Position = vec4(a_pos, -1.0, 1.0);\n}\n"
             ,&local_129);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,
             "void main(void)\n{\n\tgl_FragColor = vec4(1.0, 0.0, 0.0, 1.0);\n}\n",&local_12a);
  glu::makeVtxFragSources(&local_e8,&local_108,&local_128);
  glu::ShaderProgram::ShaderProgram(this_00,ctx,&local_e8);
  this->m_prog = this_00;
  glu::ProgramSources::~ProgramSources(&local_e8);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_108);
  return;
}

Assistant:

DebugInfoRenderer::DebugInfoRenderer (const glu::RenderContext& ctx)
	: m_ctx			(ctx)
	, m_prog		(DE_NULL)
{
	DE_ASSERT(!m_prog);
	m_prog = new glu::ShaderProgram(ctx, glu::makeVtxFragSources(
		"attribute highp vec2 a_pos;\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = vec4(a_pos, -1.0, 1.0);\n"
		"}\n",

		"void main(void)\n"
		"{\n"
		"	gl_FragColor = vec4(1.0, 0.0, 0.0, 1.0);\n"
		"}\n"));
}